

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O3

void __thiscall OpenMD::NameFinder::loadNames(NameFinder *this)

{
  ulong *puVar1;
  _func_int **pp_Var2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar4;
  Atom *pAVar5;
  RigidBody *pRVar6;
  Bond *pBVar7;
  Bend *pBVar8;
  Torsion *pTVar9;
  Inversion *pIVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  pointer ppAVar17;
  pointer ppRVar18;
  pointer ppBVar19;
  pointer ppBVar20;
  pointer ppTVar21;
  pointer ppIVar22;
  element_type *peVar23;
  string atomName;
  TreeNodePtr bondNode;
  TreeNodePtr molNode;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms;
  TreeNodePtr atomNode;
  TreeNodePtr atomNode_1;
  string molName;
  MoleculeIterator mi;
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined1 local_198 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  element_type *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  long local_168;
  Molecule *local_160;
  undefined1 local_158 [32];
  undefined1 local_138 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_118;
  MoleculeIterator local_100;
  undefined1 local_f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_100._M_node = (_Base_ptr)0x0;
  local_128._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::TreeNode,std::allocator<OpenMD::TreeNode>>
            (&_Stack_120,(TreeNode **)&local_128,(allocator<OpenMD::TreeNode> *)local_1b8);
  _Var12._M_pi = _Stack_120._M_pi;
  _Var11._M_pi = local_128._M_pi;
  local_128._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var11._M_pi;
  (this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
     _Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
  }
  peVar23 = (this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,&this->nObjects_);
  SelectionSet::resize(&peVar23->bs,(vector<int,_std::allocator<int>_> *)&local_48);
  if ((void *)local_48._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_48._M_allocated_capacity,local_38 - local_48._0_8_);
  }
  SelectionSet::setAll
            (&((this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->bs);
  local_160 = SimInfo::beginMolecule(this->info_,&local_100);
  if (local_160 != (Molecule *)0x0) {
    do {
      local_128._M_pi = &local_118;
      pcVar4 = (local_160->molStamp_->Name).data_._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,pcVar4,
                 pcVar4 + (local_160->molStamp_->Name).data_._M_string_length);
      local_58._M_allocated_capacity =
           (size_type)
           (this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58._8_8_ =
           (this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count + 1;
        }
      }
      createNode((NameFinder *)(local_198 + 0x10),(TreeNodePtr *)this,(string *)&local_58);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
      iVar3 = local_160->globalIndex_;
      iVar13 = iVar3 + 0x3f;
      if (-1 < (long)iVar3) {
        iVar13 = iVar3;
      }
      puVar1 = (ulong *)((long)(iVar13 >> 6) * 8 +
                         *(long *)(*(long *)(local_198._16_8_ + 0x20) + 200) + -8 +
                        (ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)iVar3 & 0x3f);
      ppAVar17 = (local_160->atoms_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppAVar17 !=
          (local_160->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pAVar5 = *ppAVar17;
        while (pAVar5 != (Atom *)0x0) {
          ppAVar17 = ppAVar17 + 1;
          (*(pAVar5->super_StuntDouble)._vptr_StuntDouble[7])(local_1b8,pAVar5);
          local_68._M_allocated_capacity = local_198._16_8_;
          local_68._8_8_ = local_180;
          if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_180->_M_use_count = local_180->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_180->_M_use_count = local_180->_M_use_count + 1;
            }
          }
          createNode((NameFinder *)local_158,(TreeNodePtr *)this,(string *)&local_68);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
          }
          iVar3 = (pAVar5->super_StuntDouble).globalIndex_;
          iVar13 = iVar3 + 0x3f;
          if (-1 < (long)iVar3) {
            iVar13 = iVar3;
          }
          uVar16 = (ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001);
          uVar15 = 1L << ((byte)iVar3 & 0x3f);
          puVar1 = (ulong *)(**(long **)(local_198._16_8_ + 0x20) + (long)(iVar13 >> 6) * 8 + -8 +
                            uVar16 * 8);
          *puVar1 = *puVar1 | uVar15;
          pp_Var2 = ((((RandNumGenPtr *)(local_158._0_8_ + 0x18))->
                     super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)(iVar13 >> 6) + (uVar16 - 1)
          ;
          *pp_Var2 = (_func_int *)((ulong)*pp_Var2 | uVar15);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
          }
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
          if (ppAVar17 ==
              (local_160->atoms_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) break;
          pAVar5 = *ppAVar17;
        }
      }
      ppRVar18 = (local_160->rigidBodies_).
                 super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppRVar18 !=
          (local_160->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pRVar6 = *ppRVar18;
        while (pRVar6 != (RigidBody *)0x0) {
          ppRVar18 = ppRVar18 + 1;
          (*(pRVar6->super_StuntDouble)._vptr_StuntDouble[7])(local_1b8,pRVar6);
          local_78._M_allocated_capacity = local_198._16_8_;
          local_78._8_8_ = local_180;
          if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_180->_M_use_count = local_180->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_180->_M_use_count = local_180->_M_use_count + 1;
            }
          }
          createNode((NameFinder *)local_158,(TreeNodePtr *)this,(string *)&local_78);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
          }
          iVar3 = (pRVar6->super_StuntDouble).globalIndex_;
          iVar13 = iVar3 + 0x3f;
          if (-1 < (long)iVar3) {
            iVar13 = iVar3;
          }
          uVar16 = (ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001);
          uVar15 = 1L << ((byte)iVar3 & 0x3f);
          puVar1 = (ulong *)(**(long **)(local_198._16_8_ + 0x20) + (long)(iVar13 >> 6) * 8 + -8 +
                            uVar16 * 8);
          *puVar1 = *puVar1 | uVar15;
          pp_Var2 = ((((RandNumGenPtr *)(local_158._0_8_ + 0x18))->
                     super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)(iVar13 >> 6) + (uVar16 - 1)
          ;
          *pp_Var2 = (_func_int *)((ulong)*pp_Var2 | uVar15);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
          }
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
          if (ppRVar18 ==
              (local_160->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_finish) break;
          pRVar6 = *ppRVar18;
        }
      }
      for (ppBVar19 = (local_160->bonds_).
                      super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          (ppBVar19 !=
           (local_160->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
           _M_impl.super__Vector_impl_data._M_finish && (pBVar7 = *ppBVar19, pBVar7 != (Bond *)0x0))
          ; ppBVar19 = ppBVar19 + 1) {
        (*(pBVar7->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[2])(local_1b8,pBVar7);
        local_88._M_allocated_capacity = local_198._16_8_;
        local_88._8_8_ = local_180;
        if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_180->_M_use_count = local_180->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_180->_M_use_count = local_180->_M_use_count + 1;
          }
        }
        createNode((NameFinder *)local_198,(TreeNodePtr *)this,(string *)&local_88);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
        }
        iVar3 = (pBVar7->super_ShortRangeInteraction).globalIndex_;
        iVar13 = iVar3 + 0x3f;
        if (-1 < (long)iVar3) {
          iVar13 = iVar3;
        }
        lVar14 = (long)(iVar13 >> 6) * 8;
        uVar16 = (ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001);
        uVar15 = 1L << ((byte)iVar3 & 0x3f);
        puVar1 = (ulong *)(*(long *)(*(long *)(local_198._16_8_ + 0x20) + 0x28) + lVar14 + -8 +
                          uVar16 * 8);
        *puVar1 = *puVar1 | uVar15;
        puVar1 = (ulong *)(lVar14 + *(long *)&(((RandNumGenPtr *)(local_198._0_8_ + 0x18))->
                                              super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_refcount._M_pi[2]._M_use_count + -8 + uVar16 * 8)
        ;
        *puVar1 = *puVar1 | uVar15;
        (*(pBVar7->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[8])(&local_178,pBVar7);
        peVar23 = local_178;
        if (local_178 != (element_type *)local_170._M_pi) {
          do {
            (**(code **)(*(long *)(peVar23->name)._M_dataplus._M_p + 0x38))((NameFinder *)local_158)
            ;
            local_98._M_allocated_capacity = local_198._0_8_;
            local_98._8_8_ = local_198._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
              }
            }
            createNode((NameFinder *)local_138,(TreeNodePtr *)this,(string *)&local_98);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
            }
            iVar3 = *(int *)((peVar23->name)._M_dataplus._M_p + 0x28);
            iVar13 = iVar3 + 0x3f;
            if (-1 < (long)iVar3) {
              iVar13 = iVar3;
            }
            pp_Var2 = ((((RandNumGenPtr *)(local_138._0_8_ + 0x18))->
                       super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi)->_vptr__Sp_counted_base +
                      (long)(iVar13 >> 6) +
                      ((ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001) - 1);
            *pp_Var2 = (_func_int *)((ulong)*pp_Var2 | 1L << ((byte)iVar3 & 0x3f));
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
            }
            if ((SimInfo *)local_158._0_8_ != (SimInfo *)(local_158 + 0x10)) {
              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
            }
            peVar23 = (element_type *)&(peVar23->name)._M_string_length;
          } while (peVar23 != (element_type *)local_170._M_pi);
        }
        if (local_178 != (element_type *)0x0) {
          operator_delete(local_178,local_168 - (long)local_178);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
        }
        if (local_1b8[0] != local_1a8) {
          operator_delete(local_1b8[0],local_1a8[0] + 1);
        }
      }
      for (ppBVar20 = (local_160->bends_).
                      super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          (ppBVar20 !=
           (local_160->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
           _M_impl.super__Vector_impl_data._M_finish && (pBVar8 = *ppBVar20, pBVar8 != (Bend *)0x0))
          ; ppBVar20 = ppBVar20 + 1) {
        (*(pBVar8->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[2])(local_1b8,pBVar8);
        local_a8._M_allocated_capacity = local_198._16_8_;
        local_a8._8_8_ = local_180;
        if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_180->_M_use_count = local_180->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_180->_M_use_count = local_180->_M_use_count + 1;
          }
        }
        createNode((NameFinder *)local_198,(TreeNodePtr *)this,(string *)&local_a8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
        iVar3 = (pBVar8->super_ShortRangeInteraction).globalIndex_;
        iVar13 = iVar3 + 0x3f;
        if (-1 < (long)iVar3) {
          iVar13 = iVar3;
        }
        uVar16 = (ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001);
        uVar15 = 1L << ((byte)iVar3 & 0x3f);
        puVar1 = (ulong *)(*(long *)(*(long *)(local_198._16_8_ + 0x20) + 0x50) +
                           (long)(iVar13 >> 6) * 8 + -8 + uVar16 * 8);
        *puVar1 = *puVar1 | uVar15;
        pp_Var2 = (((RandNumGenPtr *)(local_198._0_8_ + 0x18))->
                  super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi[5]._vptr__Sp_counted_base + (long)(iVar13 >> 6) + (uVar16 - 1);
        *pp_Var2 = (_func_int *)((ulong)*pp_Var2 | uVar15);
        (*(pBVar8->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[8])(&local_178,pBVar8);
        peVar23 = local_178;
        if (local_178 != (element_type *)local_170._M_pi) {
          do {
            (**(code **)(*(long *)(peVar23->name)._M_dataplus._M_p + 0x38))((NameFinder *)local_158)
            ;
            local_b8._M_allocated_capacity = local_198._0_8_;
            local_b8._8_8_ = local_198._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
              }
            }
            createNode((NameFinder *)local_138,(TreeNodePtr *)this,(string *)&local_b8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
            }
            iVar3 = *(int *)((peVar23->name)._M_dataplus._M_p + 0x28);
            iVar13 = iVar3 + 0x3f;
            if (-1 < (long)iVar3) {
              iVar13 = iVar3;
            }
            pp_Var2 = ((((RandNumGenPtr *)(local_138._0_8_ + 0x18))->
                       super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi)->_vptr__Sp_counted_base +
                      (long)(iVar13 >> 6) +
                      ((ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001) - 1);
            *pp_Var2 = (_func_int *)((ulong)*pp_Var2 | 1L << ((byte)iVar3 & 0x3f));
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
            }
            if ((SimInfo *)local_158._0_8_ != (SimInfo *)(local_158 + 0x10)) {
              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
            }
            peVar23 = (element_type *)&(peVar23->name)._M_string_length;
          } while (peVar23 != (element_type *)local_170._M_pi);
        }
        if (local_178 != (element_type *)0x0) {
          operator_delete(local_178,local_168 - (long)local_178);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
        }
        if (local_1b8[0] != local_1a8) {
          operator_delete(local_1b8[0],local_1a8[0] + 1);
        }
      }
      for (ppTVar21 = (local_160->torsions_).
                      super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          (ppTVar21 !=
           (local_160->torsions_).
           super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
           super__Vector_impl_data._M_finish && (pTVar9 = *ppTVar21, pTVar9 != (Torsion *)0x0));
          ppTVar21 = ppTVar21 + 1) {
        (*(pTVar9->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[2])(local_1b8,pTVar9);
        local_c8._M_allocated_capacity = local_198._16_8_;
        local_c8._8_8_ = local_180;
        if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_180->_M_use_count = local_180->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_180->_M_use_count = local_180->_M_use_count + 1;
          }
        }
        createNode((NameFinder *)local_198,(TreeNodePtr *)this,(string *)&local_c8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        }
        iVar3 = (pTVar9->super_ShortRangeInteraction).globalIndex_;
        iVar13 = iVar3 + 0x3f;
        if (-1 < (long)iVar3) {
          iVar13 = iVar3;
        }
        lVar14 = (long)(iVar13 >> 6) * 8;
        uVar16 = (ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001);
        uVar15 = 1L << ((byte)iVar3 & 0x3f);
        puVar1 = (ulong *)(*(long *)(*(long *)(local_198._16_8_ + 0x20) + 0x78) + lVar14 + -8 +
                          uVar16 * 8);
        *puVar1 = *puVar1 | uVar15;
        puVar1 = (ulong *)(lVar14 + *(long *)&(((RandNumGenPtr *)(local_198._0_8_ + 0x18))->
                                              super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_refcount._M_pi[7]._M_use_count + -8 + uVar16 * 8)
        ;
        *puVar1 = *puVar1 | uVar15;
        (*(pTVar9->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[8])(&local_178,pTVar9);
        peVar23 = local_178;
        if (local_178 != (element_type *)local_170._M_pi) {
          do {
            (**(code **)(*(long *)(peVar23->name)._M_dataplus._M_p + 0x38))((NameFinder *)local_158)
            ;
            local_d8._M_allocated_capacity = local_198._0_8_;
            local_d8._8_8_ = local_198._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
              }
            }
            createNode((NameFinder *)local_138,(TreeNodePtr *)this,(string *)&local_d8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
            }
            iVar3 = *(int *)((peVar23->name)._M_dataplus._M_p + 0x28);
            iVar13 = iVar3 + 0x3f;
            if (-1 < (long)iVar3) {
              iVar13 = iVar3;
            }
            pp_Var2 = ((((RandNumGenPtr *)(local_138._0_8_ + 0x18))->
                       super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi)->_vptr__Sp_counted_base +
                      (long)(iVar13 >> 6) +
                      ((ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001) - 1);
            *pp_Var2 = (_func_int *)((ulong)*pp_Var2 | 1L << ((byte)iVar3 & 0x3f));
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
            }
            if ((SimInfo *)local_158._0_8_ != (SimInfo *)(local_158 + 0x10)) {
              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
            }
            peVar23 = (element_type *)&(peVar23->name)._M_string_length;
          } while (peVar23 != (element_type *)local_170._M_pi);
        }
        if (local_178 != (element_type *)0x0) {
          operator_delete(local_178,local_168 - (long)local_178);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
        }
        if (local_1b8[0] != local_1a8) {
          operator_delete(local_1b8[0],local_1a8[0] + 1);
        }
      }
      ppIVar22 = (local_160->inversions_).
                 super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppIVar22 !=
          (local_160->inversions_).
          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          pIVar10 = *ppIVar22;
          if (pIVar10 == (Inversion *)0x0) break;
          (*(pIVar10->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[2])
                    (local_1b8,pIVar10);
          local_f8._16_8_ = local_198._16_8_;
          local_f8._24_8_ = local_180;
          if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_180->_M_use_count = local_180->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_180->_M_use_count = local_180->_M_use_count + 1;
            }
          }
          createNode((NameFinder *)local_198,(TreeNodePtr *)this,(string *)(local_f8 + 0x10));
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._24_8_);
          }
          iVar3 = (pIVar10->super_ShortRangeInteraction).globalIndex_;
          iVar13 = iVar3 + 0x3f;
          if (-1 < (long)iVar3) {
            iVar13 = iVar3;
          }
          uVar16 = (ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001);
          uVar15 = 1L << ((byte)iVar3 & 0x3f);
          puVar1 = (ulong *)(*(long *)(*(long *)(local_198._16_8_ + 0x20) + 0xa0) +
                             (long)(iVar13 >> 6) * 8 + -8 + uVar16 * 8);
          *puVar1 = *puVar1 | uVar15;
          pp_Var2 = (((RandNumGenPtr *)(local_198._0_8_ + 0x18))->
                    super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi[10]._vptr__Sp_counted_base +
                    (long)(iVar13 >> 6) + (uVar16 - 1);
          *pp_Var2 = (_func_int *)((ulong)*pp_Var2 | uVar15);
          (*(pIVar10->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[8])
                    (&local_178,pIVar10);
          peVar23 = local_178;
          if (local_178 != (element_type *)local_170._M_pi) {
            do {
              (**(code **)(*(long *)(peVar23->name)._M_dataplus._M_p + 0x38))
                        ((NameFinder *)local_158);
              local_f8._0_8_ = local_198._0_8_;
              local_f8._8_8_ = local_198._8_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)(local_198._8_8_ + 8) =
                       *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)(local_198._8_8_ + 8) =
                       *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
                }
              }
              createNode((NameFinder *)local_138,(TreeNodePtr *)this,(string *)local_f8);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
              }
              iVar3 = *(int *)((peVar23->name)._M_dataplus._M_p + 0x28);
              iVar13 = iVar3 + 0x3f;
              if (-1 < (long)iVar3) {
                iVar13 = iVar3;
              }
              pp_Var2 = ((((RandNumGenPtr *)(local_138._0_8_ + 0x18))->
                         super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi)->_vptr__Sp_counted_base +
                        (long)(iVar13 >> 6) +
                        ((ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001) - 1);
              *pp_Var2 = (_func_int *)((ulong)*pp_Var2 | 1L << ((byte)iVar3 & 0x3f));
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
              }
              if ((SimInfo *)local_158._0_8_ != (SimInfo *)(local_158 + 0x10)) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              peVar23 = (element_type *)&(peVar23->name)._M_string_length;
            } while (peVar23 != (element_type *)local_170._M_pi);
          }
          if (local_178 != (element_type *)0x0) {
            operator_delete(local_178,local_168 - (long)local_178);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
          }
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
          ppIVar22 = ppIVar22 + 1;
        } while (ppIVar22 !=
                 (local_160->inversions_).
                 super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
      }
      if (local_128._M_pi != &local_118) {
        operator_delete(local_128._M_pi,
                        (ulong)((long)&(((string *)local_118._vptr__Sp_counted_base)->_M_dataplus).
                                       _M_p + 1));
      }
      local_160 = SimInfo::nextMolecule(this->info_,&local_100);
    } while (local_160 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void NameFinder::loadNames() {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    root_ = std::make_shared<TreeNode>();
    root_->bs.resize(nObjects_);
    root_->bs.setAll();  //

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      std::string molName = mol->getType();
      TreeNodePtr molNode = createNode(root_, molName);
      molNode->bs.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        std::string atomName = atom->getType();
        TreeNodePtr atomNode = createNode(molNode, atomName);

        molNode->bs.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
        atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
      }

      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        std::string rbName = rb->getType();
        TreeNodePtr rbNode = createNode(molNode, rbName);

        molNode->bs.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());
        rbNode->bs.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());

        // COMMENTED OUT because rigid bodies are IntegrableObjects
        // (e.g. they are independently mobile, so selecting their
        // member atoms will give some odd results if we are computing
        // degrees of freedom elsewhere.

        // //create nodes for atoms belong to this rigidbody
        // for(atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai))
        // {
        //   std::string rbAtomName = atom->getType();
        //   TreeNodePtr rbAtomNode = createNode(rbNode, rbAtomName);

        //   rbAtomNode->bs.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
        // }
      }

      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        std::string bondName = bond->getName();
        TreeNodePtr bondNode = createNode(molNode, bondName);

        molNode->bs.bitsets_[BOND].setBitOn(bond->getGlobalIndex());
        bondNode->bs.bitsets_[BOND].setBitOn(bond->getGlobalIndex());

        std::vector<Atom*> atoms = bond->getAtoms();
        std::vector<Atom*>::iterator ai;

        for (ai = atoms.begin(); ai != atoms.end(); ++ai) {
          std::string atomName = (*ai)->getType();
          TreeNodePtr atomNode = createNode(bondNode, atomName);
          atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn((*ai)->getGlobalIndex());
        }
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        std::string bendName = bend->getName();
        TreeNodePtr bendNode = createNode(molNode, bendName);

        molNode->bs.bitsets_[BEND].setBitOn(bend->getGlobalIndex());
        bendNode->bs.bitsets_[BEND].setBitOn(bend->getGlobalIndex());

        std::vector<Atom*> atoms = bend->getAtoms();
        std::vector<Atom*>::iterator ai;

        for (ai = atoms.begin(); ai != atoms.end(); ++ai) {
          std::string atomName = (*ai)->getType();
          TreeNodePtr atomNode = createNode(bendNode, atomName);
          atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn((*ai)->getGlobalIndex());
        }
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        std::string torsionName = torsion->getName();
        TreeNodePtr torsionNode = createNode(molNode, torsionName);

        molNode->bs.bitsets_[TORSION].setBitOn(torsion->getGlobalIndex());
        torsionNode->bs.bitsets_[TORSION].setBitOn(torsion->getGlobalIndex());

        std::vector<Atom*> atoms = torsion->getAtoms();
        std::vector<Atom*>::iterator ai;

        for (ai = atoms.begin(); ai != atoms.end(); ++ai) {
          std::string atomName = (*ai)->getType();
          TreeNodePtr atomNode = createNode(torsionNode, atomName);
          atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn((*ai)->getGlobalIndex());
        }
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        std::string inversionName = inversion->getName();
        TreeNodePtr inversionNode = createNode(molNode, inversionName);

        molNode->bs.bitsets_[INVERSION].setBitOn(inversion->getGlobalIndex());
        inversionNode->bs.bitsets_[INVERSION].setBitOn(
            inversion->getGlobalIndex());
        std::vector<Atom*> atoms = inversion->getAtoms();
        std::vector<Atom*>::iterator ai;

        for (ai = atoms.begin(); ai != atoms.end(); ++ai) {
          std::string atomName = (*ai)->getType();
          TreeNodePtr atomNode = createNode(inversionNode, atomName);
          atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn((*ai)->getGlobalIndex());
        }
      }
    }
  }